

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

VariableData *
CreateFunctionContextVariable
          (ExpressionContext *ctx,SynBase *source,FunctionData *function,FunctionData *prototype)

{
  uint uniqueId;
  TypeBase *type;
  TypeStruct *type_00;
  uint uVar1;
  uint offset;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InplaceStr name;
  VariableData *pVVar4;
  
  if (function->scope->ownerType == (TypeBase *)0x0) {
    type = function->contextType;
    if ((type == (TypeBase *)0x0) || (type->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x21e3,
                    "VariableData *CreateFunctionContextVariable(ExpressionContext &, SynBase *, FunctionData *, FunctionData *)"
                   );
    }
    type_00 = (TypeStruct *)type[1]._vptr_TypeBase;
    if ((type_00 == (TypeStruct *)0x0) || ((type_00->super_TypeBase).typeID != 0x18)) {
      __assert_fail("classType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x21e7,
                    "VariableData *CreateFunctionContextVariable(ExpressionContext &, SynBase *, FunctionData *, FunctionData *)"
                   );
    }
    anon_unknown.dwarf_94284::FinalizeAlignment(type_00);
    if ((type_00->members).head != (MemberHandle *)0x0) {
      if (prototype != (FunctionData *)0x0) {
        pVVar4 = (VariableData *)prototype->declaration[2].source;
        pVVar4->isAlloca = false;
        uVar1 = anon_unknown.dwarf_94284::AllocateVariableInScope(ctx,source,type->alignment,type);
        pVVar4->offset = uVar1;
        return pVVar4;
      }
      offset = anon_unknown.dwarf_94284::AllocateVariableInScope(ctx,source,type->alignment,type);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      name = GetFunctionContextVariableName(ctx,function,function->functionIndex);
      SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar2),name);
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
      pVVar4 = (VariableData *)CONCAT44(extraout_var_00,iVar3);
      uVar1 = type->alignment;
      uniqueId = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uniqueId + 1;
      VariableData::VariableData
                (pVVar4,ctx->allocator,source,ctx->scope,uVar1,type,
                 (SynIdentifier *)CONCAT44(extraout_var,iVar2),offset,uniqueId);
      ExpressionContext::AddVariable(ctx,pVVar4,true);
      return pVVar4;
    }
  }
  return (VariableData *)0x0;
}

Assistant:

VariableData* CreateFunctionContextVariable(ExpressionContext &ctx, SynBase *source, FunctionData *function, FunctionData *prototype)
{
	if(function->scope->ownerType)
		return NULL;

	TypeRef *refType = getType<TypeRef>(function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	FinalizeAlignment(classType);

	if(classType->members.empty())
		return NULL;

	VariableData *context = NULL;

	if(prototype)
	{
		ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(prototype->declaration);

		context = definition->contextVariable;

		context->isAlloca = false;
		context->offset = AllocateVariableInScope(ctx, source, refType->alignment, refType);
	}
	else
	{
		// Create a variable holding a reference to a closure
		unsigned offset = AllocateVariableInScope(ctx, source, refType->alignment, refType);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(GetFunctionContextVariableName(ctx, function, ctx.GetFunctionIndex(function)));

		context = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, refType->alignment, refType, nameIdentifier, offset, ctx.uniqueVariableId++);

		ctx.AddVariable(context, true);
	}

	return context;
}